

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

bool __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
                *this)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar1;
  bool bVar2;
  
  bVar2 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::hasFastAccess(&this->left_->fadexpr_);
  if (bVar2) {
    pFVar1 = (this->right_->fadexpr_).left_;
    if (((((pFVar1->fadexpr_).left_)->dx_).num_elts != 0) &&
       ((((pFVar1->fadexpr_).right_)->dx_).num_elts != 0)) {
      return (((this->right_->fadexpr_).right_)->dx_).num_elts != 0;
    }
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}